

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall
cmFileAPI::BuildObject(Value *__return_storage_ptr__,cmFileAPI *this,Object *object)

{
  cmFileAPI *this_00;
  Value local_40;
  
  this_00 = (cmFileAPI *)0x0;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  switch(object->Kind) {
  case CodeModel:
    BuildCodeModel(&local_40,this,object);
    break;
  case ConfigureLog:
    BuildConfigureLog(&local_40,this,object);
    break;
  case Cache:
    BuildCache(&local_40,this,object);
    break;
  case CMakeFiles:
    BuildCMakeFiles(&local_40,this,object);
    break;
  case Toolchains:
    BuildToolchains(&local_40,this,object);
    break;
  case InternalTest:
    BuildInternalTest(&local_40,this_00,object);
    break;
  default:
    goto switchD_003f33b8_default;
  }
  Json::Value::operator=(__return_storage_ptr__,&local_40);
  Json::Value::~Value(&local_40);
switchD_003f33b8_default:
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildObject(Object const& object)
{
  Json::Value value;

  switch (object.Kind) {
    case ObjectKind::CodeModel:
      value = this->BuildCodeModel(object);
      break;
    case ObjectKind::ConfigureLog:
      value = this->BuildConfigureLog(object);
      break;
    case ObjectKind::Cache:
      value = this->BuildCache(object);
      break;
    case ObjectKind::CMakeFiles:
      value = this->BuildCMakeFiles(object);
      break;
    case ObjectKind::Toolchains:
      value = this->BuildToolchains(object);
      break;
    case ObjectKind::InternalTest:
      value = this->BuildInternalTest(object);
      break;
  }

  return value;
}